

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O0

bool proto2_unittest::DupEnum_TestEnumWithDupValueLite_Parse
               (string_view name,DupEnum_TestEnumWithDupValueLite *value)

{
  bool bVar1;
  int *in_R9;
  string_view name_00;
  DupEnum_TestEnumWithDupValueLite local_24;
  bool success;
  DupEnum_TestEnumWithDupValueLite *pDStack_20;
  int int_value;
  DupEnum_TestEnumWithDupValueLite *value_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  value_local = (DupEnum_TestEnumWithDupValueLite *)name._M_len;
  name_00._M_str = (char *)&local_24;
  name_00._M_len = name_local._M_len;
  pDStack_20 = value;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)DupEnum_TestEnumWithDupValueLite_entries,(EnumEntry *)0x5,
                     (size_t)value_local,name_00,in_R9);
  if (bVar1) {
    *pDStack_20 = local_24;
  }
  return bVar1;
}

Assistant:

bool DupEnum_TestEnumWithDupValueLite_Parse(::absl::string_view name, DupEnum_TestEnumWithDupValueLite* PROTOBUF_NONNULL value) {
  int int_value;
  bool success = ::google::protobuf::internal::LookUpEnumValue(
      DupEnum_TestEnumWithDupValueLite_entries, 5, name, &int_value);
  if (success) {
    *value = static_cast<DupEnum_TestEnumWithDupValueLite>(int_value);
  }
  return success;
}